

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatEntry.cpp
# Opt level: O3

string * __thiscall
FatEntry::getShortFilename_abi_cxx11_(string *__return_storage_ptr__,FatEntry *this)

{
  string s;
  string s_00;
  int iVar1;
  string base;
  string ext;
  _Alloc_hider in_stack_ffffffffffffff48;
  size_type in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  string local_98;
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::substr((ulong)local_58,(ulong)this);
  s._M_string_length = in_stack_ffffffffffffff50;
  s._M_dataplus._M_p = in_stack_ffffffffffffff48._M_p;
  s.field_2._M_allocated_capacity = in_stack_ffffffffffffff58;
  s.field_2._8_8_ = in_stack_ffffffffffffff60;
  trim(&local_38,s);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  std::__cxx11::string::substr((ulong)local_78,(ulong)this);
  s_00._M_string_length = in_stack_ffffffffffffff50;
  s_00._M_dataplus._M_p = in_stack_ffffffffffffff48._M_p;
  s_00.field_2._M_allocated_capacity = in_stack_ffffffffffffff58;
  s_00.field_2._8_8_ = in_stack_ffffffffffffff60;
  trim(&local_98,s_00);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (*(this->shortName)._M_dataplus._M_p == -0x1b) {
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff48,(ulong)&local_98);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&stack0xffffffffffffff48);
    if (in_stack_ffffffffffffff48._M_p != &stack0xffffffffffffff58) {
      operator_delete(in_stack_ffffffffffffff48._M_p,in_stack_ffffffffffffff58 + 1);
    }
  }
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar1 != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff48,".",&local_38);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)in_stack_ffffffffffffff48._M_p);
    if (in_stack_ffffffffffffff48._M_p != &stack0xffffffffffffff58) {
      operator_delete(in_stack_ffffffffffffff48._M_p,in_stack_ffffffffffffff58 + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string FatEntry::getShortFilename()
{
    string name;
    string ext = trim(shortName.substr(8,3));
    string base = trim(shortName.substr(0,8));

    if (isErased()) {
        base = base.substr(1);
    }

    name = base;

    if (ext != "") {
        name += "." + ext;
    }

    return name;
}